

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O3

void secp256k1_scratch_destroy(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  long lVar88;
  ulong uVar89;
  char *pcVar90;
  byte *extraout_RDX;
  ulong uVar91;
  secp256k1_ge *a;
  uint uVar92;
  secp256k1_ge *a_00;
  ulong uVar93;
  secp256k1_fe *a_01;
  bool bVar94;
  secp256k1_gej sStack_248;
  secp256k1_ge *psStack_1b0;
  ulong uStack_1a8;
  secp256k1_fe *psStack_1a0;
  secp256k1_scratch *psStack_198;
  ulong uStack_188;
  ulong uStack_180;
  secp256k1_fe sStack_178;
  secp256k1_fe sStack_148;
  secp256k1_ge_storage sStack_118;
  ulong uStack_d8;
  undefined1 auStack_d0 [56];
  uint64_t uStack_98;
  uint64_t uStack_90;
  uint64_t uStack_88;
  uint64_t uStack_80;
  undefined8 uStack_78;
  int iStack_70;
  secp256k1_fe sStack_68;
  
  if (scratch == (secp256k1_scratch *)0x0) {
    return;
  }
  lVar88 = 0;
  pcVar90 = "scratch";
  do {
    if (scratch->magic[lVar88] != "scratch"[lVar88]) {
      (*error_callback->fn)("invalid scratch space",error_callback->data);
      return;
    }
    lVar88 = lVar88 + 1;
  } while (lVar88 != 8);
  if (scratch->alloc_size == 0) {
    free(scratch);
    return;
  }
  secp256k1_scratch_destroy_cold_1();
  if (error_callback == (secp256k1_callback *)0x0) {
    psStack_198 = (secp256k1_scratch *)0x1083c1;
    secp256k1_ec_pubkey_parse_cold_5();
  }
  else if (scratch != (secp256k1_scratch *)0x0) {
    scratch[1].alloc_size = 0;
    scratch[1].max_size = 0;
    scratch[1].magic[0] = '\0';
    scratch[1].magic[1] = '\0';
    scratch[1].magic[2] = '\0';
    scratch[1].magic[3] = '\0';
    scratch[1].magic[4] = '\0';
    scratch[1].magic[5] = '\0';
    scratch[1].magic[6] = '\0';
    scratch[1].magic[7] = '\0';
    scratch[1].data = (void *)0x0;
    scratch->alloc_size = 0;
    scratch->max_size = 0;
    scratch->magic[0] = '\0';
    scratch->magic[1] = '\0';
    scratch->magic[2] = '\0';
    scratch->magic[3] = '\0';
    scratch->magic[4] = '\0';
    scratch->magic[5] = '\0';
    scratch->magic[6] = '\0';
    scratch->magic[7] = '\0';
    scratch->data = (void *)0x0;
    if (extraout_RDX == (byte *)0x0) {
      psStack_198 = (secp256k1_scratch *)0x1083cd;
      secp256k1_ec_pubkey_parse_cold_3();
      return;
    }
    if (pcVar90 == (char *)0x41) {
      if (7 < *extraout_RDX) {
        return;
      }
      if ((0xd0U >> (*extraout_RDX & 0x1f) & 1) == 0) {
        return;
      }
      psStack_198 = (secp256k1_scratch *)0x107cf7;
      secp256k1_fe_impl_set_b32_mod(&sStack_148,extraout_RDX + 1);
      iVar87 = 0;
      if (((sStack_148.n[0] < 0xffffefffffc2f) || (sStack_148.n[4] != 0xffffffffffff)) ||
         ((sStack_148.n[2] & sStack_148.n[3] & sStack_148.n[1]) != 0xfffffffffffff)) {
        sStack_148.magnitude = 1;
        sStack_148.normalized = 1;
        psStack_198 = (secp256k1_scratch *)0x107d40;
        secp256k1_fe_verify(&sStack_148);
        psStack_198 = (secp256k1_scratch *)0x107d51;
        secp256k1_fe_impl_set_b32_mod(&sStack_178,extraout_RDX + 0x21);
        if (((sStack_178.n[0] < 0xffffefffffc2f) || (sStack_178.n[4] != 0xffffffffffff)) ||
           ((sStack_178.n[2] & sStack_178.n[3] & sStack_178.n[1]) != 0xfffffffffffff)) {
          a_01 = &sStack_178;
          sStack_178.magnitude = 1;
          sStack_178.normalized = 1;
          psStack_198 = (secp256k1_scratch *)0x107da7;
          secp256k1_fe_verify(a_01);
          psStack_198 = (secp256k1_scratch *)0x107dbc;
          secp256k1_ge_set_xy((secp256k1_ge *)auStack_d0,&sStack_148,a_01);
          if ((*extraout_RDX & 0xfe) == 6) {
            psStack_198 = (secp256k1_scratch *)0x107dce;
            secp256k1_fe_verify(&sStack_178);
            if ((*extraout_RDX != 7) == (bool)((byte)sStack_178.n[0] & 1)) goto LAB_001082fc;
          }
          psStack_198 = (secp256k1_scratch *)0x107df1;
          secp256k1_ge_verify((secp256k1_ge *)auStack_d0);
          uVar91 = 0;
          iVar87 = 0;
          if (iStack_70 == 0) {
            a = (secp256k1_ge *)(auStack_d0 + 0x30);
            psStack_198 = (secp256k1_scratch *)0x107e0e;
            a_00 = a;
            secp256k1_fe_verify((secp256k1_fe *)a);
            if ((int)uStack_78 < 9) {
              a_01 = (secp256k1_fe *)0xfffffffffffff;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = auStack_d0._48_8_ * 2;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uStack_88;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uStack_98 * 2;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uStack_90;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uStack_80;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = uStack_80;
              uVar89 = SUB168(auVar3 * auVar43,0);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar89 & 0xfffffffffffff;
              auVar1 = auVar2 * auVar42 + auVar1 * auVar41 + auVar4 * ZEXT816(0x1000003d10);
              uVar91 = auVar1._0_8_;
              sStack_68.n[0] = uVar91 & 0xfffffffffffff;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar91 >> 0x34 | auVar1._8_8_ << 0xc;
              uVar91 = uStack_80 * 2;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = auStack_d0._48_8_;
              auVar44._8_8_ = 0;
              auVar44._0_8_ = uVar91;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uStack_98 * 2;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = uStack_88;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uStack_90;
              auVar46._8_8_ = 0;
              auVar46._0_8_ = uStack_90;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = uVar89 >> 0x34 | SUB168(auVar3 * auVar43,8) << 0xc;
              auVar1 = auVar5 * auVar44 + auVar73 + auVar6 * auVar45 + auVar7 * auVar46 +
                       auVar8 * ZEXT816(0x1000003d10);
              uStack_180 = auVar1._0_8_;
              auVar74._8_8_ = 0;
              auVar74._0_8_ = uStack_180 >> 0x34 | auVar1._8_8_ << 0xc;
              uStack_188 = (uStack_180 & 0xfffffffffffff) >> 0x30;
              uStack_180 = uStack_180 & 0xffffffffffff;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = auStack_d0._48_8_;
              auVar47._8_8_ = 0;
              auVar47._0_8_ = auStack_d0._48_8_;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = uStack_98;
              auVar48._8_8_ = 0;
              auVar48._0_8_ = uVar91;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = uStack_90 * 2;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = uStack_88;
              auVar1 = auVar10 * auVar48 + auVar74 + auVar11 * auVar49;
              uVar89 = auVar1._0_8_;
              auVar76._8_8_ = 0;
              auVar76._0_8_ = uVar89 >> 0x34 | auVar1._8_8_ << 0xc;
              auVar50._8_8_ = 0;
              auVar50._0_8_ = (uVar89 & 0xfffffffffffff) << 4 | uStack_188;
              auVar1 = auVar9 * auVar47 + ZEXT816(0x1000003d1) * auVar50;
              uVar89 = auVar1._0_8_;
              sStack_118.x.n[0] = uVar89 & 0xfffffffffffff;
              auVar75._8_8_ = 0;
              auVar75._0_8_ = uVar89 >> 0x34 | auVar1._8_8_ << 0xc;
              auVar12._8_8_ = 0;
              auVar12._0_8_ = auStack_d0._48_8_ * 2;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = uStack_98;
              auVar13._8_8_ = 0;
              auVar13._0_8_ = uStack_90;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = uVar91;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = uStack_88;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = uStack_88;
              auVar2 = auVar13 * auVar52 + auVar76 + auVar14 * auVar53;
              uVar89 = auVar2._0_8_;
              auVar15._8_8_ = 0;
              auVar15._0_8_ = uVar89 & 0xfffffffffffff;
              auVar1 = auVar12 * auVar51 + auVar75 + auVar15 * ZEXT816(0x1000003d10);
              uVar93 = auVar1._0_8_;
              auVar78._8_8_ = 0;
              auVar78._0_8_ = uVar89 >> 0x34 | auVar2._8_8_ << 0xc;
              sStack_118.x.n[1] = uVar93 & 0xfffffffffffff;
              auVar77._8_8_ = 0;
              auVar77._0_8_ = uVar93 >> 0x34 | auVar1._8_8_ << 0xc;
              auVar16._8_8_ = 0;
              auVar16._0_8_ = auStack_d0._48_8_ * 2;
              auVar54._8_8_ = 0;
              auVar54._0_8_ = uStack_90;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = uStack_98;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = uStack_98;
              auVar18._8_8_ = 0;
              auVar18._0_8_ = uStack_88;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = uVar91;
              auVar78 = auVar18 * auVar56 + auVar78;
              uVar89 = auVar78._0_8_;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = uVar89 & 0xfffffffffffff;
              auVar1 = auVar16 * auVar54 + auVar77 + auVar17 * auVar55 +
                       auVar19 * ZEXT816(0x1000003d10);
              uVar93 = auVar1._0_8_;
              sStack_118.x.n[2] = uVar93 & 0xfffffffffffff;
              auVar79._8_8_ = 0;
              auVar79._0_8_ = (uVar93 >> 0x34 | auVar1._8_8_ << 0xc) + sStack_68.n[0];
              auVar20._8_8_ = 0;
              auVar20._0_8_ = uVar89 >> 0x34 | auVar78._8_8_ << 0xc;
              auVar79 = auVar20 * ZEXT816(0x1000003d10) + auVar79;
              uVar89 = auVar79._0_8_;
              sStack_118.x.n[3] = uVar89 & 0xfffffffffffff;
              sStack_118.y.n[0] = (uVar89 >> 0x34 | auVar79._8_8_ << 0xc) + uStack_180;
              sStack_118.y.n[1] = 1;
              psStack_198 = (secp256k1_scratch *)0x108058;
              secp256k1_fe_verify((secp256k1_fe *)&sStack_118);
              a = (secp256k1_ge *)auStack_d0;
              psStack_198 = (secp256k1_scratch *)0x108068;
              a_00 = a;
              secp256k1_fe_verify((secp256k1_fe *)a);
              if ((int)auStack_d0._40_4_ < 9) {
                auVar21._8_8_ = 0;
                auVar21._0_8_ = auStack_d0._0_8_ * 2;
                auVar57._8_8_ = 0;
                auVar57._0_8_ = auStack_d0._24_8_;
                auVar22._8_8_ = 0;
                auVar22._0_8_ = auStack_d0._8_8_ * 2;
                auVar58._8_8_ = 0;
                auVar58._0_8_ = auStack_d0._16_8_;
                auVar23._8_8_ = 0;
                auVar23._0_8_ = auStack_d0._32_8_;
                auVar59._8_8_ = 0;
                auVar59._0_8_ = auStack_d0._32_8_;
                uVar89 = SUB168(auVar23 * auVar59,0);
                auVar24._8_8_ = 0;
                auVar24._0_8_ = uVar89 & 0xfffffffffffff;
                auVar1 = auVar22 * auVar58 + auVar21 * auVar57 + auVar24 * ZEXT816(0x1000003d10);
                uVar91 = auVar1._0_8_;
                uStack_180 = uVar91 & 0xfffffffffffff;
                auVar80._8_8_ = 0;
                auVar80._0_8_ = uVar91 >> 0x34 | auVar1._8_8_ << 0xc;
                uVar91 = auStack_d0._32_8_ * 2;
                auVar25._8_8_ = 0;
                auVar25._0_8_ = auStack_d0._0_8_;
                auVar60._8_8_ = 0;
                auVar60._0_8_ = uVar91;
                auVar26._8_8_ = 0;
                auVar26._0_8_ = auStack_d0._8_8_ * 2;
                auVar61._8_8_ = 0;
                auVar61._0_8_ = auStack_d0._24_8_;
                auVar27._8_8_ = 0;
                auVar27._0_8_ = auStack_d0._16_8_;
                auVar62._8_8_ = 0;
                auVar62._0_8_ = auStack_d0._16_8_;
                auVar28._8_8_ = 0;
                auVar28._0_8_ = uVar89 >> 0x34 | SUB168(auVar23 * auVar59,8) << 0xc;
                auVar1 = auVar25 * auVar60 + auVar80 + auVar26 * auVar61 + auVar27 * auVar62 +
                         auVar28 * ZEXT816(0x1000003d10);
                uStack_188 = auVar1._0_8_;
                auVar81._8_8_ = 0;
                auVar81._0_8_ = uStack_188 >> 0x34 | auVar1._8_8_ << 0xc;
                uStack_d8 = (uStack_188 & 0xfffffffffffff) >> 0x30;
                uStack_188 = uStack_188 & 0xffffffffffff;
                auVar29._8_8_ = 0;
                auVar29._0_8_ = auStack_d0._0_8_;
                auVar63._8_8_ = 0;
                auVar63._0_8_ = auStack_d0._0_8_;
                auVar30._8_8_ = 0;
                auVar30._0_8_ = auStack_d0._8_8_;
                auVar64._8_8_ = 0;
                auVar64._0_8_ = uVar91;
                auVar31._8_8_ = 0;
                auVar31._0_8_ = auStack_d0._16_8_ * 2;
                auVar65._8_8_ = 0;
                auVar65._0_8_ = auStack_d0._24_8_;
                auVar1 = auVar30 * auVar64 + auVar81 + auVar31 * auVar65;
                uVar89 = auVar1._0_8_;
                auVar83._8_8_ = 0;
                auVar83._0_8_ = uVar89 >> 0x34 | auVar1._8_8_ << 0xc;
                auVar66._8_8_ = 0;
                auVar66._0_8_ = (uVar89 & 0xfffffffffffff) << 4 | uStack_d8;
                auVar1 = auVar29 * auVar63 + ZEXT816(0x1000003d1) * auVar66;
                uVar89 = auVar1._0_8_;
                sStack_68.n[0] = uVar89 & 0xfffffffffffff;
                auVar82._8_8_ = 0;
                auVar82._0_8_ = uVar89 >> 0x34 | auVar1._8_8_ << 0xc;
                auVar32._8_8_ = 0;
                auVar32._0_8_ = auStack_d0._0_8_ * 2;
                auVar67._8_8_ = 0;
                auVar67._0_8_ = auStack_d0._8_8_;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = auStack_d0._16_8_;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar91;
                auVar34._8_8_ = 0;
                auVar34._0_8_ = auStack_d0._24_8_;
                auVar69._8_8_ = 0;
                auVar69._0_8_ = auStack_d0._24_8_;
                auVar2 = auVar33 * auVar68 + auVar83 + auVar34 * auVar69;
                uVar89 = auVar2._0_8_;
                auVar35._8_8_ = 0;
                auVar35._0_8_ = uVar89 & 0xfffffffffffff;
                auVar1 = auVar32 * auVar67 + auVar82 + auVar35 * ZEXT816(0x1000003d10);
                uVar93 = auVar1._0_8_;
                auVar85._8_8_ = 0;
                auVar85._0_8_ = uVar89 >> 0x34 | auVar2._8_8_ << 0xc;
                sStack_68.n[1] = uVar93 & 0xfffffffffffff;
                auVar84._8_8_ = 0;
                auVar84._0_8_ = uVar93 >> 0x34 | auVar1._8_8_ << 0xc;
                auVar36._8_8_ = 0;
                auVar36._0_8_ = auStack_d0._0_8_ * 2;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = auStack_d0._16_8_;
                auVar37._8_8_ = 0;
                auVar37._0_8_ = auStack_d0._8_8_;
                auVar71._8_8_ = 0;
                auVar71._0_8_ = auStack_d0._8_8_;
                auVar38._8_8_ = 0;
                auVar38._0_8_ = auStack_d0._24_8_;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = uVar91;
                auVar85 = auVar38 * auVar72 + auVar85;
                uVar91 = auVar85._0_8_;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar91 & 0xfffffffffffff;
                auVar1 = auVar36 * auVar70 + auVar84 + auVar37 * auVar71 +
                         auVar39 * ZEXT816(0x1000003d10);
                uVar89 = auVar1._0_8_;
                sStack_68.n[2] = uVar89 & 0xfffffffffffff;
                auVar86._8_8_ = 0;
                auVar86._0_8_ = (uVar89 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_180;
                auVar40._8_8_ = 0;
                auVar40._0_8_ = uVar91 >> 0x34 | auVar85._8_8_ << 0xc;
                auVar86 = auVar40 * ZEXT816(0x1000003d10) + auVar86;
                uVar91 = auVar86._0_8_;
                sStack_68.n[3] = uVar91 & 0xfffffffffffff;
                sStack_68.n[4] = (uVar91 >> 0x34 | auVar86._8_8_ << 0xc) + uStack_188;
                sStack_68.magnitude = 1;
                sStack_68.normalized = 0;
                psStack_198 = (secp256k1_scratch *)0x1082b8;
                secp256k1_fe_verify(&sStack_68);
                psStack_198 = (secp256k1_scratch *)0x1082cb;
                secp256k1_fe_mul(&sStack_68,&sStack_68,(secp256k1_fe *)auStack_d0);
                psStack_198 = (secp256k1_scratch *)0x1082d3;
                secp256k1_fe_verify(&sStack_68);
                sStack_68.n[0] = sStack_68.n[0] + 2;
                sStack_68.normalized = 0;
                sStack_68.magnitude = sStack_68.magnitude + 1;
                psStack_198 = (secp256k1_scratch *)0x1082e9;
                secp256k1_fe_verify(&sStack_68);
                psStack_198 = (secp256k1_scratch *)0x1082f6;
                iVar87 = secp256k1_fe_equal_var((secp256k1_fe *)&sStack_118,&sStack_68);
                goto LAB_001082fc;
              }
            }
            else {
              psStack_198 = (secp256k1_scratch *)0x1083d7;
              secp256k1_ec_pubkey_parse_cold_2();
            }
            psStack_198 = (secp256k1_scratch *)secp256k1_ge_is_in_correct_subgroup;
            secp256k1_ec_pubkey_parse_cold_1();
            psStack_1b0 = a;
            uStack_1a8 = uVar91;
            psStack_1a0 = a_01;
            psStack_198 = scratch;
            secp256k1_ge_verify(a_00);
            secp256k1_gej_set_infinity(&sStack_248);
            uVar92 = 0x1f;
            do {
              secp256k1_gej_double_var(&sStack_248,&sStack_248,(secp256k1_fe *)0x0);
              if ((0xdU >> (uVar92 & 0x1f) & 1) != 0) {
                secp256k1_gej_add_ge_var(&sStack_248,&sStack_248,a_00,(secp256k1_fe *)0x0);
              }
              bVar94 = uVar92 != 0;
              uVar92 = uVar92 - 1;
            } while (bVar94);
            secp256k1_gej_verify(&sStack_248);
            return;
          }
        }
      }
    }
    else {
      if (pcVar90 != (char *)0x21) {
        return;
      }
      if ((*extraout_RDX & 0xfe) != 2) {
        return;
      }
      psStack_198 = (secp256k1_scratch *)0x107c2c;
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)&sStack_118,extraout_RDX + 1);
      if (((sStack_118.x.n[0] < 0xffffefffffc2f) || (sStack_118.y.n[0] != 0xffffffffffff)) ||
         (iVar87 = 0, (sStack_118.x.n[2] & sStack_118.x.n[3] & sStack_118.x.n[1]) != 0xfffffffffffff
         )) {
        sStack_118.y.n[1] = 0x100000001;
        psStack_198 = (secp256k1_scratch *)0x107c98;
        secp256k1_fe_verify((secp256k1_fe *)&sStack_118);
        psStack_198 = (secp256k1_scratch *)0x107cb0;
        iVar87 = secp256k1_ge_set_xo_var
                           ((secp256k1_ge *)auStack_d0,(secp256k1_fe *)&sStack_118,
                            (uint)(*extraout_RDX == 3));
      }
    }
LAB_001082fc:
    if (iVar87 == 0) {
      return;
    }
    psStack_198 = (secp256k1_scratch *)0x108312;
    iVar87 = secp256k1_ge_is_in_correct_subgroup((secp256k1_ge *)auStack_d0);
    if (iVar87 == 0) {
      return;
    }
    psStack_198 = (secp256k1_scratch *)0x108332;
    secp256k1_ge_to_storage(&sStack_118,(secp256k1_ge *)auStack_d0);
    scratch[1].alloc_size = sStack_118.y.n[2];
    scratch[1].max_size = sStack_118.y.n[3];
    *(uint64_t *)scratch[1].magic = sStack_118.y.n[0];
    scratch[1].data = (void *)sStack_118.y.n[1];
    scratch->alloc_size = sStack_118.x.n[2];
    scratch->max_size = sStack_118.x.n[3];
    *(uint64_t *)scratch->magic = sStack_118.x.n[0];
    scratch->data = (void *)sStack_118.x.n[1];
    iStack_70 = 0;
    auStack_d0._40_4_ = 0;
    auStack_d0._44_4_ = 1;
    auStack_d0._0_8_ = 0;
    auStack_d0._8_8_ = 0;
    auStack_d0._16_8_ = 0;
    auStack_d0._24_8_ = 0;
    auStack_d0._32_8_ = 0;
    psStack_198 = (secp256k1_scratch *)0x108382;
    secp256k1_fe_verify((secp256k1_fe *)auStack_d0);
    uStack_78._0_4_ = 0;
    uStack_78._4_4_ = 1;
    auStack_d0._48_8_ = 0;
    uStack_98 = 0;
    uStack_90 = 0;
    uStack_88 = 0;
    uStack_80 = 0;
    psStack_198 = (secp256k1_scratch *)0x1083a1;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_d0 + 0x30));
    return;
  }
  psStack_198 = (secp256k1_scratch *)0x1083c6;
  secp256k1_ec_pubkey_parse_cold_4();
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}